

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall
llvm::Expected<llvm::DWARFDebugNames::Entry>::moveConstruct<llvm::DWARFDebugNames::Entry>
          (Expected<llvm::DWARFDebugNames::Entry> *this,
          Expected<llvm::DWARFDebugNames::Entry> *Other)

{
  storage_type *this_00;
  storage_type *psVar1;
  error_type *this_01;
  error_type *peVar2;
  Expected<llvm::DWARFDebugNames::Entry> *Other_local;
  Expected<llvm::DWARFDebugNames::Entry> *this_local;
  
  this->field_0xb8 = this->field_0xb8 & 0xfe | Other->field_0xb8 & 1;
  if ((this->field_0xb8 & 1) == 0) {
    this_00 = getStorage(this);
    psVar1 = getStorage(Other);
    DWARFDebugNames::Entry::Entry(this_00,psVar1);
  }
  else {
    this_01 = getErrorStorage(this);
    peVar2 = getErrorStorage(Other);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (this_01,peVar2);
  }
  return;
}

Assistant:

void moveConstruct(Expected<OtherT> &&Other) {
    HasError = Other.HasError;
#if LLVM_ENABLE_ABI_BREAKING_CHECKS
    Unchecked = true;
    Other.Unchecked = false;
#endif

    if (!HasError)
      new (getStorage()) storage_type(std::move(*Other.getStorage()));
    else
      new (getErrorStorage()) error_type(std::move(*Other.getErrorStorage()));
  }